

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_slider_int(nk_context *ctx,int min,int *val,int max,int step)

{
  int iVar1;
  float value;
  float local_14;
  
  local_14 = (float)*val;
  iVar1 = nk_slider_float(ctx,(float)min,&local_14,(float)max,(float)step);
  *val = (int)local_14;
  return iVar1;
}

Assistant:

NK_API int
nk_slider_int(struct nk_context *ctx, int min, int *val, int max, int step)
{
    int ret;
    float value = (float)*val;
    ret = nk_slider_float(ctx, (float)min, &value, (float)max, (float)step);
    *val =  (int)value;
    return ret;
}